

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UtilizationContainer.cpp
# Opt level: O1

void __thiscall UtilizationContainer::updateLegend(UtilizationContainer *this)

{
  int *piVar1;
  int iVar2;
  QString *pQVar3;
  QByteArrayView QVar4;
  QByteArrayView QVar5;
  QByteArrayView QVar6;
  QByteArrayView QVar7;
  QString t;
  QArrayData *local_70;
  undefined8 local_68;
  undefined8 uStack_60;
  QArrayData *local_58;
  undefined8 local_50;
  undefined8 uStack_48;
  undefined4 local_40;
  undefined4 uStack_3c;
  undefined4 uStack_38;
  undefined4 uStack_34;
  undefined8 local_30;
  undefined4 local_28;
  undefined4 uStack_24;
  undefined4 uStack_20;
  undefined4 uStack_1c;
  undefined8 local_18;
  
  QVar4.m_data = (storage_type *)0x9;
  QVar4.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar4);
  local_28 = local_40;
  uStack_24 = uStack_3c;
  uStack_20 = uStack_38;
  uStack_1c = uStack_34;
  local_18 = local_30;
  pQVar3 = (QString *)qt_qFindChild_helper(this,&local_28,&QLabel::staticMetaObject,1);
  iVar2 = SettingsManager::getUpdateDelay();
  QString::number((double)((float)iVar2 / 1000.0),(char)&local_58,0x67);
  local_70 = local_58;
  local_68 = local_50;
  uStack_60 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar5.m_data = (storage_type *)0x9;
  QVar5.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar5);
  QString::append((QString *)&local_70);
  piVar1 = (int *)CONCAT44(uStack_3c,local_40);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_3c,local_40),2,8);
    }
  }
  QLabel::setText(pQVar3);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_24,local_28);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_24,local_28),2,8);
    }
  }
  QVar6.m_data = (storage_type *)0x9;
  QVar6.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar6);
  local_28 = local_40;
  uStack_24 = uStack_3c;
  uStack_20 = uStack_38;
  uStack_1c = uStack_34;
  local_18 = local_30;
  pQVar3 = (QString *)qt_qFindChild_helper(this,&local_28,&QLabel::staticMetaObject,1);
  iVar2 = SettingsManager::getGraphLength();
  QString::number((double)((float)iVar2 / 1000.0),(char)&local_58,0x67);
  local_70 = local_58;
  local_68 = local_50;
  uStack_60 = uStack_48;
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  QVar7.m_data = (storage_type *)0x4;
  QVar7.m_size = (qsizetype)&local_40;
  QString::fromUtf8(QVar7);
  QString::append((QString *)&local_70);
  piVar1 = (int *)CONCAT44(uStack_3c,local_40);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_3c,local_40),2,8);
    }
  }
  QLabel::setText(pQVar3);
  if (local_70 != (QArrayData *)0x0) {
    LOCK();
    (local_70->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_70->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_70->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_70,2,8);
    }
  }
  if (local_58 != (QArrayData *)0x0) {
    LOCK();
    (local_58->ref_)._q_value.super___atomic_base<int>._M_i =
         (local_58->ref_)._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if ((local_58->ref_)._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(local_58,2,8);
    }
  }
  piVar1 = (int *)CONCAT44(uStack_24,local_28);
  if (piVar1 != (int *)0x0) {
    LOCK();
    *piVar1 = *piVar1 + -1;
    UNLOCK();
    if (*piVar1 == 0) {
      QArrayData::deallocate((QArrayData *)CONCAT44(uStack_24,local_28),2,8);
    }
  }
  onLegendUpdate(this);
  return;
}

Assistant:

void UtilizationContainer::updateLegend() {
    findChild<QLabel*>(graphStepName)->setText(QString::number(SettingsManager::getUpdateDelay() / 1000.0f) + " sec step");
    findChild<QLabel*>(graphTimeName)->setText(QString::number(SettingsManager::getGraphLength() / 1000.0f) + " sec");
    emit onLegendUpdate();
}